

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int xmlFAParsePiece(xmlRegParserCtxtPtr ctxt)

{
  int iVar1;
  int ret;
  xmlRegParserCtxtPtr ctxt_local;
  
  ctxt->atom = (xmlRegAtomPtr)0x0;
  iVar1 = xmlFAParseAtom(ctxt);
  if (iVar1 == 0) {
    ctxt_local._4_4_ = 0;
  }
  else {
    if (ctxt->atom == (xmlRegAtomPtr)0x0) {
      ctxt->error = 0x5aa;
      xmlRegexpErrCompile(ctxt,"internal: no atom generated");
    }
    xmlFAParseQuantifier(ctxt);
    ctxt_local._4_4_ = 1;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlFAParsePiece(xmlRegParserCtxtPtr ctxt) {
    int ret;

    ctxt->atom = NULL;
    ret = xmlFAParseAtom(ctxt);
    if (ret == 0)
	return(0);
    if (ctxt->atom == NULL) {
	ERROR("internal: no atom generated");
    }
    xmlFAParseQuantifier(ctxt);
    return(1);
}